

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

void Cec_ManSimSavePattern(Cec_ManSim_t *p,int iPat)

{
  int iVar1;
  Abc_Cex_t *pAVar2;
  uint *p_00;
  int local_24;
  int i;
  uint *pInfo;
  int iPat_local;
  Cec_ManSim_t *p_local;
  
  if (p->pCexComb != (Abc_Cex_t *)0x0) {
    __assert_fail("p->pCexComb == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x20a,"void Cec_ManSimSavePattern(Cec_ManSim_t *, int)");
  }
  if ((-1 < iPat) && (iPat < p->nWords * 0x20)) {
    iVar1 = Gia_ManCiNum(p->pAig);
    iVar1 = Abc_BitWordNum(iVar1);
    pAVar2 = (Abc_Cex_t *)calloc((long)iVar1 * 4 + 0x14,1);
    p->pCexComb = pAVar2;
    p->pCexComb->iPo = p->iOut;
    iVar1 = Gia_ManCiNum(p->pAig);
    p->pCexComb->nPis = iVar1;
    iVar1 = Gia_ManCiNum(p->pAig);
    p->pCexComb->nBits = iVar1;
    local_24 = 0;
    while( true ) {
      iVar1 = Gia_ManCiNum(p->pAig);
      if (iVar1 <= local_24) break;
      p_00 = (uint *)Vec_PtrEntry(p->vCiSimInfo,local_24);
      iVar1 = Abc_InfoHasBit(p_00,iPat);
      if (iVar1 != 0) {
        Abc_InfoSetBit((uint *)(p->pCexComb + 1),local_24);
      }
      local_24 = local_24 + 1;
    }
    return;
  }
  __assert_fail("iPat >= 0 && iPat < 32 * p->nWords",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                ,0x20b,"void Cec_ManSimSavePattern(Cec_ManSim_t *, int)");
}

Assistant:

void Cec_ManSimSavePattern( Cec_ManSim_t * p, int iPat )
{
    unsigned * pInfo;
    int i;
    assert( p->pCexComb == NULL );
    assert( iPat >= 0 && iPat < 32 * p->nWords );
    p->pCexComb = (Abc_Cex_t *)ABC_CALLOC( char, 
        sizeof(Abc_Cex_t) + sizeof(unsigned) * Abc_BitWordNum(Gia_ManCiNum(p->pAig)) );
    p->pCexComb->iPo = p->iOut;
    p->pCexComb->nPis = Gia_ManCiNum(p->pAig);
    p->pCexComb->nBits = Gia_ManCiNum(p->pAig);
    for ( i = 0; i < Gia_ManCiNum(p->pAig); i++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( p->vCiSimInfo, i );
        if ( Abc_InfoHasBit( pInfo, iPat ) )
            Abc_InfoSetBit( p->pCexComb->pData, i );
    }
}